

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O3

Result * CoreML::validateLSTMWeightParams
                   (Result *__return_storage_ptr__,LSTMWeightParams *lstmWeightParams,
                   LSTMParams *lstmParams)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  uint uVar6;
  WeightParamType *wt;
  WeightParams *pWVar7;
  pointer pWVar8;
  WeightParamType WVar9;
  int iVar10;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *__range1;
  uint uVar11;
  int iVar12;
  uint uVar13;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> weightTypes;
  string err;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> local_58;
  string local_40;
  
  bVar1 = lstmParams->hasbiasvectors_;
  bVar2 = lstmParams->haspeepholevectors_;
  local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_start = (WeightParamType *)0x0;
  local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (WeightParamType *)0x0;
  local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (WeightParamType *)0x0;
  pWVar7 = lstmWeightParams->inputgateweightmatrix_;
  if (pWVar7 == (WeightParams *)0x0) {
    pWVar7 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar10 = (pWVar7->floatvalue_).current_size_;
  sVar3 = ((pWVar7->float16value_).ptr_)->_M_string_length;
  uVar13 = (0 < iVar10) + 1;
  if (sVar3 == 0) {
    uVar13 = (uint)(0 < iVar10);
  }
  sVar4 = ((pWVar7->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((pWVar7->int8rawvalue_).ptr_)->_M_string_length;
  uVar6 = (uint)(sVar5 == 0);
  uVar13 = (uVar13 - (sVar4 == 0)) + 2;
  uVar11 = 4;
  if (uVar13 - uVar6 < 2) {
    uVar11 = 5;
    if (uVar13 != uVar6) {
      uVar11 = (uint)(iVar10 < 1);
    }
    if (((((sVar3 == 0) && (iVar10 < 1)) && (uVar13 != uVar6)) &&
        (((sVar4 == 0 || (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (uVar11 = 2, pWVar7->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar5 == 0 || (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_))
        || (uVar11 = 3, pWVar7->quantization_ == (QuantizationParams *)0x0)))) {
      uVar11 = 5;
    }
  }
  local_40._M_dataplus._M_p._0_4_ = uVar11;
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  _M_realloc_insert<CoreML::WeightParamType>(&local_58,(iterator)0x0,(WeightParamType *)&local_40);
  pWVar7 = lstmWeightParams->forgetgateweightmatrix_;
  if (pWVar7 == (WeightParams *)0x0) {
    pWVar7 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar10 = (pWVar7->floatvalue_).current_size_;
  sVar3 = ((pWVar7->float16value_).ptr_)->_M_string_length;
  uVar13 = (0 < iVar10) + 1;
  if (sVar3 == 0) {
    uVar13 = (uint)(0 < iVar10);
  }
  sVar4 = ((pWVar7->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((pWVar7->int8rawvalue_).ptr_)->_M_string_length;
  uVar6 = (uint)(sVar5 == 0);
  uVar13 = (uVar13 - (sVar4 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar13 - uVar6 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar13 != uVar6) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if ((((sVar3 == 0) && (iVar10 < 1)) && (uVar13 != uVar6)) &&
       ((((sVar4 == 0 || (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (local_40._M_dataplus._M_p._0_4_ = QUINT,
               pWVar7->quantization_ == (QuantizationParams *)0x0)) &&
        (((sVar5 == 0 || (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (local_40._M_dataplus._M_p._0_4_ = QINT,
               pWVar7->quantization_ == (QuantizationParams *)0x0)))))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pWVar7 = lstmWeightParams->blockinputweightmatrix_;
  if (pWVar7 == (WeightParams *)0x0) {
    pWVar7 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar10 = (pWVar7->floatvalue_).current_size_;
  sVar3 = ((pWVar7->float16value_).ptr_)->_M_string_length;
  uVar13 = (0 < iVar10) + 1;
  if (sVar3 == 0) {
    uVar13 = (uint)(0 < iVar10);
  }
  sVar4 = ((pWVar7->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((pWVar7->int8rawvalue_).ptr_)->_M_string_length;
  uVar6 = (uint)(sVar5 == 0);
  uVar13 = (uVar13 - (sVar4 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar13 - uVar6 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar13 != uVar6) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if (((((sVar3 == 0) && (iVar10 < 1)) && (uVar13 != uVar6)) &&
        (((sVar4 == 0 || (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (local_40._M_dataplus._M_p._0_4_ = QUINT,
               pWVar7->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar5 == 0 || (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_))
        || (local_40._M_dataplus._M_p._0_4_ = QINT,
           pWVar7->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pWVar7 = lstmWeightParams->outputgateweightmatrix_;
  if (pWVar7 == (WeightParams *)0x0) {
    pWVar7 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar10 = (pWVar7->floatvalue_).current_size_;
  sVar3 = ((pWVar7->float16value_).ptr_)->_M_string_length;
  uVar13 = (0 < iVar10) + 1;
  if (sVar3 == 0) {
    uVar13 = (uint)(0 < iVar10);
  }
  sVar4 = ((pWVar7->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((pWVar7->int8rawvalue_).ptr_)->_M_string_length;
  uVar6 = (uint)(sVar5 == 0);
  uVar13 = (uVar13 - (sVar4 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar13 - uVar6 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar13 != uVar6) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if (((((sVar3 == 0) && (iVar10 < 1)) && (uVar13 != uVar6)) &&
        (((sVar4 == 0 || (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (local_40._M_dataplus._M_p._0_4_ = QUINT,
               pWVar7->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar5 == 0 || (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_))
        || (local_40._M_dataplus._M_p._0_4_ = QINT,
           pWVar7->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pWVar7 = lstmWeightParams->inputgaterecursionmatrix_;
  if (pWVar7 == (WeightParams *)0x0) {
    pWVar7 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar10 = (pWVar7->floatvalue_).current_size_;
  sVar3 = ((pWVar7->float16value_).ptr_)->_M_string_length;
  uVar13 = (0 < iVar10) + 1;
  if (sVar3 == 0) {
    uVar13 = (uint)(0 < iVar10);
  }
  sVar4 = ((pWVar7->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((pWVar7->int8rawvalue_).ptr_)->_M_string_length;
  uVar6 = (uint)(sVar5 == 0);
  uVar13 = (uVar13 - (sVar4 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar13 - uVar6 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar13 != uVar6) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if (((((sVar3 == 0) && (iVar10 < 1)) && (uVar13 != uVar6)) &&
        (((sVar4 == 0 || (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (local_40._M_dataplus._M_p._0_4_ = QUINT,
               pWVar7->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar5 == 0 || (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_))
        || (local_40._M_dataplus._M_p._0_4_ = QINT,
           pWVar7->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pWVar7 = lstmWeightParams->forgetgaterecursionmatrix_;
  if (pWVar7 == (WeightParams *)0x0) {
    pWVar7 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar10 = (pWVar7->floatvalue_).current_size_;
  sVar3 = ((pWVar7->float16value_).ptr_)->_M_string_length;
  uVar13 = (0 < iVar10) + 1;
  if (sVar3 == 0) {
    uVar13 = (uint)(0 < iVar10);
  }
  sVar4 = ((pWVar7->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((pWVar7->int8rawvalue_).ptr_)->_M_string_length;
  uVar6 = (uint)(sVar5 == 0);
  uVar13 = (uVar13 - (sVar4 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar13 - uVar6 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar13 != uVar6) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if (((((sVar3 == 0) && (iVar10 < 1)) && (uVar13 != uVar6)) &&
        (((sVar4 == 0 || (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (local_40._M_dataplus._M_p._0_4_ = QUINT,
               pWVar7->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar5 == 0 || (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_))
        || (local_40._M_dataplus._M_p._0_4_ = QINT,
           pWVar7->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pWVar7 = lstmWeightParams->blockinputrecursionmatrix_;
  if (pWVar7 == (WeightParams *)0x0) {
    pWVar7 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar10 = (pWVar7->floatvalue_).current_size_;
  sVar3 = ((pWVar7->float16value_).ptr_)->_M_string_length;
  uVar13 = (0 < iVar10) + 1;
  if (sVar3 == 0) {
    uVar13 = (uint)(0 < iVar10);
  }
  sVar4 = ((pWVar7->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((pWVar7->int8rawvalue_).ptr_)->_M_string_length;
  uVar6 = (uint)(sVar5 == 0);
  uVar13 = (uVar13 - (sVar4 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar13 - uVar6 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar13 != uVar6) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if (((((sVar3 == 0) && (iVar10 < 1)) && (uVar13 != uVar6)) &&
        (((sVar4 == 0 || (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (local_40._M_dataplus._M_p._0_4_ = QUINT,
               pWVar7->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar5 == 0 || (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_))
        || (local_40._M_dataplus._M_p._0_4_ = QINT,
           pWVar7->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pWVar7 = lstmWeightParams->outputgaterecursionmatrix_;
  if (pWVar7 == (WeightParams *)0x0) {
    pWVar7 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar10 = (pWVar7->floatvalue_).current_size_;
  sVar3 = ((pWVar7->float16value_).ptr_)->_M_string_length;
  uVar13 = (0 < iVar10) + 1;
  if (sVar3 == 0) {
    uVar13 = (uint)(0 < iVar10);
  }
  sVar4 = ((pWVar7->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((pWVar7->int8rawvalue_).ptr_)->_M_string_length;
  uVar6 = (uint)(sVar5 == 0);
  uVar13 = (uVar13 - (sVar4 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar13 - uVar6 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar13 != uVar6) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if ((((sVar3 == 0) && (iVar10 < 1)) && (uVar13 != uVar6)) &&
       ((((sVar4 == 0 || (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (local_40._M_dataplus._M_p._0_4_ = QUINT,
               pWVar7->quantization_ == (QuantizationParams *)0x0)) &&
        (((sVar5 == 0 || (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (local_40._M_dataplus._M_p._0_4_ = QINT,
               pWVar7->quantization_ == (QuantizationParams *)0x0)))))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (bVar1 != false) {
    pWVar7 = lstmWeightParams->inputgatebiasvector_;
    if (pWVar7 == (WeightParams *)0x0) {
      pWVar7 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar10 = (pWVar7->floatvalue_).current_size_;
    sVar3 = ((pWVar7->float16value_).ptr_)->_M_string_length;
    uVar13 = (0 < iVar10) + 1;
    if (sVar3 == 0) {
      uVar13 = (uint)(0 < iVar10);
    }
    sVar4 = ((pWVar7->rawvalue_).ptr_)->_M_string_length;
    sVar5 = ((pWVar7->int8rawvalue_).ptr_)->_M_string_length;
    uVar6 = (uint)(sVar5 == 0);
    uVar13 = (uVar13 - (sVar4 == 0)) + 2;
    WVar9 = UNSPECIFIED;
    if (uVar13 - uVar6 < 2) {
      WVar9 = EMPTY;
      if (uVar13 != uVar6) {
        WVar9 = (uint)(iVar10 < 1);
      }
      if (((((sVar3 == 0) && (iVar10 < 1)) && (uVar13 != uVar6)) &&
          (((sVar4 == 0 ||
            (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (WVar9 = QUINT, pWVar7->quantization_ == (QuantizationParams *)0x0)))) &&
         (((sVar5 == 0 ||
           (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
          (WVar9 = QINT, pWVar7->quantization_ == (QuantizationParams *)0x0)))) {
        WVar9 = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_40._M_dataplus._M_p._0_4_ = WVar9;
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = WVar9;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pWVar7 = lstmWeightParams->forgetgatebiasvector_;
    if (pWVar7 == (WeightParams *)0x0) {
      pWVar7 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar10 = (pWVar7->floatvalue_).current_size_;
    sVar3 = ((pWVar7->float16value_).ptr_)->_M_string_length;
    uVar13 = (0 < iVar10) + 1;
    if (sVar3 == 0) {
      uVar13 = (uint)(0 < iVar10);
    }
    sVar4 = ((pWVar7->rawvalue_).ptr_)->_M_string_length;
    sVar5 = ((pWVar7->int8rawvalue_).ptr_)->_M_string_length;
    uVar6 = (uint)(sVar5 == 0);
    uVar13 = (uVar13 - (sVar4 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar13 - uVar6 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar13 != uVar6) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
      }
      if (((((sVar3 == 0) && (iVar10 < 1)) && (uVar13 != uVar6)) &&
          (((sVar4 == 0 ||
            (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           pWVar7->quantization_ == (QuantizationParams *)0x0)))) &&
         (((sVar5 == 0 ||
           (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
          (local_40._M_dataplus._M_p._0_4_ = QINT,
          pWVar7->quantization_ == (QuantizationParams *)0x0)))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pWVar7 = lstmWeightParams->blockinputbiasvector_;
    if (pWVar7 == (WeightParams *)0x0) {
      pWVar7 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar10 = (pWVar7->floatvalue_).current_size_;
    sVar3 = ((pWVar7->float16value_).ptr_)->_M_string_length;
    uVar13 = (0 < iVar10) + 1;
    if (sVar3 == 0) {
      uVar13 = (uint)(0 < iVar10);
    }
    sVar4 = ((pWVar7->rawvalue_).ptr_)->_M_string_length;
    sVar5 = ((pWVar7->int8rawvalue_).ptr_)->_M_string_length;
    uVar6 = (uint)(sVar5 == 0);
    uVar13 = (uVar13 - (sVar4 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar13 - uVar6 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar13 != uVar6) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
      }
      if ((((sVar3 == 0) && (iVar10 < 1)) && (uVar13 != uVar6)) &&
         ((((sVar4 == 0 ||
            (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           pWVar7->quantization_ == (QuantizationParams *)0x0)) &&
          (((sVar5 == 0 ||
            (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QINT,
           pWVar7->quantization_ == (QuantizationParams *)0x0)))))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pWVar7 = lstmWeightParams->outputgatebiasvector_;
    if (pWVar7 == (WeightParams *)0x0) {
      pWVar7 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar10 = (pWVar7->floatvalue_).current_size_;
    sVar3 = ((pWVar7->float16value_).ptr_)->_M_string_length;
    uVar13 = (0 < iVar10) + 1;
    if (sVar3 == 0) {
      uVar13 = (uint)(0 < iVar10);
    }
    sVar4 = ((pWVar7->rawvalue_).ptr_)->_M_string_length;
    sVar5 = ((pWVar7->int8rawvalue_).ptr_)->_M_string_length;
    uVar6 = (uint)(sVar5 == 0);
    uVar13 = (uVar13 - (sVar4 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar13 - uVar6 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar13 != uVar6) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
      }
      if (((((sVar3 == 0) && (iVar10 < 1)) && (uVar13 != uVar6)) &&
          (((sVar4 == 0 ||
            (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           pWVar7->quantization_ == (QuantizationParams *)0x0)))) &&
         (((sVar5 == 0 ||
           (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
          (local_40._M_dataplus._M_p._0_4_ = QINT,
          pWVar7->quantization_ == (QuantizationParams *)0x0)))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if (bVar2 != false) {
    pWVar7 = lstmWeightParams->inputgatepeepholevector_;
    if (pWVar7 == (WeightParams *)0x0) {
      pWVar7 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar10 = (pWVar7->floatvalue_).current_size_;
    sVar3 = ((pWVar7->float16value_).ptr_)->_M_string_length;
    uVar13 = (0 < iVar10) + 1;
    if (sVar3 == 0) {
      uVar13 = (uint)(0 < iVar10);
    }
    sVar4 = ((pWVar7->rawvalue_).ptr_)->_M_string_length;
    sVar5 = ((pWVar7->int8rawvalue_).ptr_)->_M_string_length;
    uVar6 = (uint)(sVar5 == 0);
    uVar13 = (uVar13 - (sVar4 == 0)) + 2;
    WVar9 = UNSPECIFIED;
    if (uVar13 - uVar6 < 2) {
      WVar9 = EMPTY;
      if (uVar13 != uVar6) {
        WVar9 = (uint)(iVar10 < 1);
      }
      if (((((sVar3 == 0) && (iVar10 < 1)) && (uVar13 != uVar6)) &&
          (((sVar4 == 0 ||
            (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (WVar9 = QUINT, pWVar7->quantization_ == (QuantizationParams *)0x0)))) &&
         (((sVar5 == 0 ||
           (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
          (WVar9 = QINT, pWVar7->quantization_ == (QuantizationParams *)0x0)))) {
        WVar9 = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_40._M_dataplus._M_p._0_4_ = WVar9;
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = WVar9;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pWVar7 = lstmWeightParams->forgetgatepeepholevector_;
    if (pWVar7 == (WeightParams *)0x0) {
      pWVar7 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar10 = (pWVar7->floatvalue_).current_size_;
    sVar3 = ((pWVar7->float16value_).ptr_)->_M_string_length;
    uVar13 = (0 < iVar10) + 1;
    if (sVar3 == 0) {
      uVar13 = (uint)(0 < iVar10);
    }
    sVar4 = ((pWVar7->rawvalue_).ptr_)->_M_string_length;
    sVar5 = ((pWVar7->int8rawvalue_).ptr_)->_M_string_length;
    uVar6 = (uint)(sVar5 == 0);
    uVar13 = (uVar13 - (sVar4 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar13 - uVar6 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar13 != uVar6) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
      }
      if ((((sVar3 == 0) && (iVar10 < 1)) && (uVar13 != uVar6)) &&
         ((((sVar4 == 0 ||
            (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           pWVar7->quantization_ == (QuantizationParams *)0x0)) &&
          (((sVar5 == 0 ||
            (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QINT,
           pWVar7->quantization_ == (QuantizationParams *)0x0)))))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pWVar7 = lstmWeightParams->outputgatepeepholevector_;
    if (pWVar7 == (WeightParams *)0x0) {
      pWVar7 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar10 = (pWVar7->floatvalue_).current_size_;
    sVar3 = ((pWVar7->float16value_).ptr_)->_M_string_length;
    uVar13 = (0 < iVar10) + 1;
    if (sVar3 == 0) {
      uVar13 = (uint)(0 < iVar10);
    }
    sVar4 = ((pWVar7->rawvalue_).ptr_)->_M_string_length;
    sVar5 = ((pWVar7->int8rawvalue_).ptr_)->_M_string_length;
    uVar6 = (uint)(sVar5 == 0);
    uVar13 = (uVar13 - (sVar4 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar13 - uVar6 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar13 != uVar6) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
      }
      if (((((sVar3 == 0) && (iVar10 < 1)) && (uVar13 != uVar6)) &&
          (((sVar4 == 0 ||
            (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           pWVar7->quantization_ == (QuantizationParams *)0x0)))) &&
         (((sVar5 == 0 ||
           (pWVar7 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
          (local_40._M_dataplus._M_p._0_4_ = QINT,
          pWVar7->quantization_ == (QuantizationParams *)0x0)))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar10 = 0;
    iVar12 = 0;
    pWVar8 = local_58.
             super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      if (*pWVar8 == FLOAT16) {
        iVar12 = iVar12 + 1;
      }
      else if (*pWVar8 == FLOAT32) {
        iVar10 = iVar10 + 1;
      }
      if (0 < iVar10 * iVar12) {
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,
                   "LSTM weight parameters have inconsistent field value types. Types should match and should be either half or full precision"
                   ,"");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002e68dd;
      }
      pWVar8 = pWVar8 + 1;
    } while (pWVar8 != local_58.
                       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  Result::Result(__return_storage_ptr__);
LAB_002e68dd:
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_start != (WeightParamType *)0x0) {
    operator_delete(local_58.
                    super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateLSTMWeightParams(const Specification::LSTMWeightParams& lstmWeightParams, const Specification::LSTMParams lstmParams) {
    bool has_peephole_vector = lstmParams.haspeepholevectors();
    bool has_bias_vector = lstmParams.hasbiasvectors();
    
    // Validate all weightParam types match
    std::vector<CoreML::WeightParamType> weightTypes;
    weightTypes.push_back(valueType(lstmWeightParams.inputgateweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.forgetgateweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.blockinputweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.outputgateweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.inputgaterecursionmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.forgetgaterecursionmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.blockinputrecursionmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.outputgaterecursionmatrix()));
    if(has_bias_vector){
        weightTypes.push_back(valueType(lstmWeightParams.inputgatebiasvector()));
        weightTypes.push_back(valueType(lstmWeightParams.forgetgatebiasvector()));
        weightTypes.push_back(valueType(lstmWeightParams.blockinputbiasvector()));
        weightTypes.push_back(valueType(lstmWeightParams.outputgatebiasvector()));
    }
    if(has_peephole_vector){
        weightTypes.push_back(valueType(lstmWeightParams.inputgatepeepholevector()));
        weightTypes.push_back(valueType(lstmWeightParams.forgetgatepeepholevector()));
        weightTypes.push_back(valueType(lstmWeightParams.outputgatepeepholevector()));
    }
    if(!isWeightParamTypeCompatible(weightTypes)){
        const std::string err = "LSTM weight parameters have inconsistent field value types. "
        "Types should match and should be either half or full precision";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}